

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addPattern<Catch::TestSpec::TagPattern>(TestSpecParser *this)

{
  byte bVar1;
  ulong uVar2;
  string *tag;
  Pattern *in_RDI;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  TestSpecParser *in_stack_ffffffffffffff48;
  Ptr<Catch::TestSpec::Pattern> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff60;
  allocator *this_00;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  subString_abi_cxx11_(in_stack_ffffffffffffff48);
  this_00 = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"exclude:",this_00);
  bVar1 = startsWith(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((bVar1 & 1) != 0) {
    *(undefined1 *)
     ((long)&(in_RDI->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
             _vptr_NonCopyable + 4) = 1;
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)local_28);
    std::__cxx11::string::operator=(local_28,(string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    tag = (string *)operator_new(0x30);
    TestSpec::TagPattern::TagPattern((TagPattern *)CONCAT17(bVar1,in_stack_ffffffffffffff60),tag);
    Ptr<Catch::TestSpec::Pattern>::Ptr
              (in_stack_ffffffffffffff50,(Pattern *)in_stack_ffffffffffffff48);
    if (((ulong)(in_RDI->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                _vptr_NonCopyable & 0x100000000) != 0) {
      in_stack_ffffffffffffff50 = (Ptr<Catch::TestSpec::Pattern> *)operator_new(0x18);
      TestSpec::ExcludedPattern::ExcludedPattern
                ((ExcludedPattern *)CONCAT17(bVar1,in_stack_ffffffffffffff60),
                 (Ptr<Catch::TestSpec::Pattern> *)tag);
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)this_00,in_RDI);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                 *)CONCAT17(bVar1,in_stack_ffffffffffffff60),(value_type *)tag);
    Ptr<Catch::TestSpec::Pattern>::~Ptr(in_stack_ffffffffffffff50);
  }
  *(undefined1 *)
   ((long)&(in_RDI->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
           _vptr_NonCopyable + 4) = 0;
  *(undefined4 *)
   &(in_RDI->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable = 0
  ;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }